

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall
Sock::Accept(Sock *this,sockaddr *addr,socklen_t *addr_len)

{
  socklen_t *in_RCX;
  long in_FS_OFFSET;
  int socket;
  _func_int **local_28;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_Sock = (_func_int **)0x0;
  local_1c = accept(*(int *)(addr->sa_data + 6),(sockaddr *)addr_len,in_RCX);
  if (local_1c != -1) {
    std::make_unique<Sock,int_const&>((int *)&local_28);
    this->_vptr_Sock = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Sock::Accept(sockaddr* addr, socklen_t* addr_len) const
{
#ifdef WIN32
    static constexpr auto ERR = INVALID_SOCKET;
#else
    static constexpr auto ERR = SOCKET_ERROR;
#endif

    std::unique_ptr<Sock> sock;

    const auto socket = accept(m_socket, addr, addr_len);
    if (socket != ERR) {
        try {
            sock = std::make_unique<Sock>(socket);
        } catch (const std::exception&) {
#ifdef WIN32
            closesocket(socket);
#else
            close(socket);
#endif
        }
    }

    return sock;
}